

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O1

void __thiscall
helics::BrokerApp::BrokerApp
          (BrokerApp *this,CoreType ctype,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  BrokerApp(this,ctype,&local_30,args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                             local_30.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

BrokerApp::BrokerApp(CoreType ctype, std::vector<std::string>& args):
    BrokerApp(ctype, std::string{}, args)
{
}